

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten.cpp
# Opt level: O1

void duckdb::ListFlattenFunction(DataChunk *args,ExpressionState *param_2,Vector *result)

{
  ulong *puVar1;
  idx_t count;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  sel_t *psVar3;
  sel_t *psVar4;
  byte bVar5;
  element_type *peVar6;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  bool bVar9;
  reference this;
  Vector *pVVar10;
  idx_t iVar11;
  TemplatedValidityData<unsigned_long> *pTVar12;
  ulong uVar13;
  ulong uVar14;
  data_ptr_t pdVar15;
  idx_t iVar16;
  idx_t iVar17;
  long lVar18;
  ulong uVar19;
  idx_t idx_in_entry_1;
  sel_t sVar20;
  idx_t idx_in_entry;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  SelectionVector sel;
  UnifiedVectorFormat outer_format;
  UnifiedVectorFormat inner_format;
  UnifiedVectorFormat items_format;
  SelectionVector local_168;
  element_type *local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_140;
  Vector *local_130;
  buffer_ptr<ValidityBuffer> *local_128;
  data_ptr_t local_120;
  idx_t local_118;
  idx_t local_110;
  UnifiedVectorFormat local_108;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  pdVar15 = result->data;
  FlatVector::VerifyFlatVector(result);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_108);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  this = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  count = args->count;
  Vector::ToUnifiedFormat(this,count,&local_108);
  if ((this->type).id_ == SQLNULL) {
    Vector::Reference(result,this);
  }
  else {
    pVVar10 = ListVector::GetEntry(this);
    iVar11 = ListVector::GetListSize(this);
    Vector::ToUnifiedFormat(pVVar10,iVar11,&local_c0);
    if ((pVVar10->type).id_ == SQLNULL) {
      if (count != 0) {
        uVar21 = 0;
        do {
          uVar14 = uVar21;
          if ((local_108.sel)->sel_vector != (sel_t *)0x0) {
            uVar14 = (ulong)(local_108.sel)->sel_vector[uVar21];
          }
          if ((local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0) ||
             ((local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0)) {
            pdVar15[0] = '\0';
            pdVar15[1] = '\0';
            pdVar15[2] = '\0';
            pdVar15[3] = '\0';
            pdVar15[4] = '\0';
            pdVar15[5] = '\0';
            pdVar15[6] = '\0';
            pdVar15[7] = '\0';
            pdVar15[8] = '\0';
            pdVar15[9] = '\0';
            pdVar15[10] = '\0';
            pdVar15[0xb] = '\0';
            pdVar15[0xc] = '\0';
            pdVar15[0xd] = '\0';
            pdVar15[0xe] = '\0';
            pdVar15[0xf] = '\0';
          }
          else {
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_148 = (element_type *)
                          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_168,(unsigned_long *)&local_148);
              peVar6 = local_168.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              psVar3 = local_168.sel_vector;
              local_168.sel_vector = (sel_t *)0x0;
              local_168.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              p_Var2 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)psVar3;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar6;
              if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_168.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_168.selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
              }
              pTVar12 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                    validity_data);
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar12->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar5 = (byte)uVar21 & 0x3f;
            puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar21 >> 6);
            *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
          }
          uVar21 = uVar21 + 1;
          pdVar15 = pdVar15 + 0x10;
        } while (count != uVar21);
      }
      bVar9 = DataChunk::AllConstant(args);
      if (bVar9) {
        Vector::SetVectorType(result,CONSTANT_VECTOR);
      }
    }
    else {
      local_130 = ListVector::GetEntry(pVVar10);
      iVar11 = ListVector::GetListSize(pVVar10);
      Vector::ToUnifiedFormat(local_130,iVar11,&local_78);
      if (count == 0) {
        iVar11 = 0;
      }
      else {
        iVar11 = 0;
        iVar16 = 0;
        do {
          iVar17 = iVar16;
          if ((local_108.sel)->sel_vector != (sel_t *)0x0) {
            iVar17 = (idx_t)(local_108.sel)->sel_vector[iVar16];
          }
          if ((local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0) ||
             ((local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [iVar17 >> 6] >> (iVar17 & 0x3f) & 1) != 0)) {
            uVar21 = *(ulong *)(local_108.data + iVar17 * 0x10);
            lVar18 = *(long *)(local_108.data + iVar17 * 0x10 + 8);
            if (uVar21 < lVar18 + uVar21) {
              do {
                uVar14 = uVar21;
                if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
                  uVar14 = (ulong)(local_c0.sel)->sel_vector[uVar21];
                }
                if ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                     (unsigned_long *)0x0) ||
                   ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0)) {
                  iVar11 = iVar11 + *(long *)(local_c0.data + uVar14 * 0x10 + 8);
                }
                uVar21 = uVar21 + 1;
                lVar18 = lVar18 + -1;
              } while (lVar18 != 0);
            }
          }
          iVar16 = iVar16 + 1;
        } while (iVar16 != count);
      }
      SelectionVector::SelectionVector(&local_168,iVar11);
      if (count == 0) {
        iVar11 = 0;
      }
      else {
        local_120 = local_108.data;
        local_128 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        uVar21 = 0;
        iVar16 = 0;
        do {
          uVar14 = uVar21;
          if ((local_108.sel)->sel_vector != (sel_t *)0x0) {
            uVar14 = (ulong)(local_108.sel)->sel_vector[uVar21];
          }
          iVar11 = iVar16;
          if ((local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0) ||
             ((local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0)) {
            uVar13 = *(ulong *)(local_120 + uVar14 * 0x10);
            uVar14 = *(long *)(local_120 + uVar14 * 0x10 + 8) + uVar13;
            if (uVar13 < uVar14) {
              psVar3 = (local_c0.sel)->sel_vector;
              lVar18 = 0;
              do {
                uVar22 = uVar13;
                if (psVar3 != (sel_t *)0x0) {
                  uVar22 = (ulong)psVar3[uVar13];
                }
                if ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                     (unsigned_long *)0x0) ||
                   ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                     [uVar22 >> 6] >> (uVar22 & 0x3f) & 1) != 0)) {
                  uVar19 = *(ulong *)(local_c0.data + uVar22 * 0x10);
                  lVar23 = *(long *)(local_c0.data + uVar22 * 0x10 + 8);
                  lVar18 = lVar18 + lVar23;
                  if (uVar19 < uVar19 + lVar23) {
                    psVar4 = (local_78.sel)->sel_vector;
                    do {
                      sVar20 = (sel_t)uVar19;
                      if (psVar4 != (sel_t *)0x0) {
                        sVar20 = psVar4[uVar19];
                      }
                      *(sel_t *)((long)&(((unsafe_unique_array<unsigned_long> *)local_168.sel_vector
                                         )->
                                        super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                                        )._M_t.
                                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                + iVar11 * 4) = sVar20;
                      iVar11 = iVar11 + 1;
                      uVar19 = uVar19 + 1;
                      lVar23 = lVar23 + -1;
                    } while (lVar23 != 0);
                  }
                }
                uVar13 = uVar13 + 1;
              } while (uVar13 != uVar14);
            }
            else {
              lVar18 = 0;
            }
            *(idx_t *)(pdVar15 + uVar21 * 0x10) = iVar16;
            *(long *)(pdVar15 + uVar21 * 0x10 + 8) = lVar18;
            local_118 = iVar16;
          }
          else {
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_110 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_148,&local_110);
              p_Var8 = p_Stack_140;
              peVar7 = local_148;
              local_148 = (element_type *)0x0;
              p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var2 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = peVar7;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var8;
              if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
              }
              if (p_Stack_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_140);
              }
              pTVar12 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_128);
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar12->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar5 = (byte)uVar21 & 0x3f;
            puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar21 >> 6);
            *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
          }
          uVar21 = uVar21 + 1;
          iVar16 = iVar11;
        } while (uVar21 != count);
      }
      ListVector::SetListSize(result,iVar11);
      pVVar10 = ListVector::GetEntry(result);
      Vector::Slice(pVVar10,local_130,&local_168,iVar11);
      Vector::Flatten(pVVar10,iVar11);
      bVar9 = DataChunk::AllConstant(args);
      if (bVar9) {
        Vector::SetVectorType(result,CONSTANT_VECTOR);
      }
      if (local_168.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_168.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
    }
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_108.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void ListFlattenFunction(DataChunk &args, ExpressionState &, Vector &result) {

	const auto flat_list_data = FlatVector::GetData<list_entry_t>(result);
	auto &flat_list_mask = FlatVector::Validity(result);

	UnifiedVectorFormat outer_format;
	UnifiedVectorFormat inner_format;
	UnifiedVectorFormat items_format;

	// Setup outer vec;
	auto &outer_vec = args.data[0];
	const auto outer_count = args.size();
	outer_vec.ToUnifiedFormat(outer_count, outer_format);

	// Special case: outer list is all-null
	if (outer_vec.GetType().id() == LogicalTypeId::SQLNULL) {
		result.Reference(outer_vec);
		return;
	}

	// Setup inner vec
	auto &inner_vec = ListVector::GetEntry(outer_vec);
	const auto inner_count = ListVector::GetListSize(outer_vec);
	inner_vec.ToUnifiedFormat(inner_count, inner_format);

	// Special case: inner list is all-null
	if (inner_vec.GetType().id() == LogicalTypeId::SQLNULL) {
		for (idx_t outer_raw_idx = 0; outer_raw_idx < outer_count; outer_raw_idx++) {
			const auto outer_idx = outer_format.sel->get_index(outer_raw_idx);
			if (!outer_format.validity.RowIsValid(outer_idx)) {
				flat_list_mask.SetInvalid(outer_raw_idx);
				continue;
			}
			flat_list_data[outer_raw_idx].offset = 0;
			flat_list_data[outer_raw_idx].length = 0;
		}
		if (args.AllConstant()) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
		}
		return;
	}

	// Setup items vec
	auto &items_vec = ListVector::GetEntry(inner_vec);
	const auto items_count = ListVector::GetListSize(inner_vec);
	items_vec.ToUnifiedFormat(items_count, items_format);

	// First pass: Figure out the total amount of items.
	// This can be more than items_count if the inner list reference the same item(s) multiple times.

	idx_t total_items = 0;

	const auto outer_data = UnifiedVectorFormat::GetData<list_entry_t>(outer_format);
	const auto inner_data = UnifiedVectorFormat::GetData<list_entry_t>(inner_format);

	for (idx_t outer_raw_idx = 0; outer_raw_idx < outer_count; outer_raw_idx++) {
		const auto outer_idx = outer_format.sel->get_index(outer_raw_idx);

		if (!outer_format.validity.RowIsValid(outer_idx)) {
			continue;
		}

		const auto &outer_entry = outer_data[outer_idx];

		for (idx_t inner_raw_idx = outer_entry.offset; inner_raw_idx < outer_entry.offset + outer_entry.length;
		     inner_raw_idx++) {
			const auto inner_idx = inner_format.sel->get_index(inner_raw_idx);

			if (!inner_format.validity.RowIsValid(inner_idx)) {
				continue;
			}

			const auto &inner_entry = inner_data[inner_idx];

			total_items += inner_entry.length;
		}
	}

	// Now we know the total amount of items, we can create our selection vector.
	SelectionVector sel(total_items);
	idx_t sel_idx = 0;

	// Second pass: Fill the selection vector (and the result list entries)

	for (idx_t outer_raw_idx = 0; outer_raw_idx < outer_count; outer_raw_idx++) {
		const auto outer_idx = outer_format.sel->get_index(outer_raw_idx);

		if (!outer_format.validity.RowIsValid(outer_idx)) {
			flat_list_mask.SetInvalid(outer_raw_idx);
			continue;
		}

		const auto &outer_entry = outer_data[outer_idx];

		list_entry_t list_entry = {sel_idx, 0};

		for (idx_t inner_raw_idx = outer_entry.offset; inner_raw_idx < outer_entry.offset + outer_entry.length;
		     inner_raw_idx++) {
			const auto inner_idx = inner_format.sel->get_index(inner_raw_idx);

			if (!inner_format.validity.RowIsValid(inner_idx)) {
				continue;
			}

			const auto &inner_entry = inner_data[inner_idx];

			list_entry.length += inner_entry.length;

			for (idx_t elem_raw_idx = inner_entry.offset; elem_raw_idx < inner_entry.offset + inner_entry.length;
			     elem_raw_idx++) {
				const auto elem_idx = items_format.sel->get_index(elem_raw_idx);

				sel.set_index(sel_idx, elem_idx);
				sel_idx++;
			}
		}

		// Assign the result list entry
		flat_list_data[outer_raw_idx] = list_entry;
	}

	// Now assing the result
	ListVector::SetListSize(result, sel_idx);

	auto &result_child_vector = ListVector::GetEntry(result);
	result_child_vector.Slice(items_vec, sel, sel_idx);
	result_child_vector.Flatten(sel_idx);

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}